

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWrite.cpp
# Opt level: O2

bool __thiscall stk::FileWrite::setRawFile(FileWrite *this,string *fileName)

{
  long lVar1;
  FILE *pFVar2;
  ostream *poVar3;
  
  lVar1 = std::__cxx11::string::find((char *)fileName,0x111223);
  if (lVar1 == -1) {
    std::__cxx11::string::append((char *)fileName);
  }
  pFVar2 = fopen((fileName->_M_dataplus)._M_p,"wb");
  this->fd_ = (FILE *)pFVar2;
  if (pFVar2 == (FILE *)0x0) {
    poVar3 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,
                             "FileWrite: could not create RAW file: ");
    poVar3 = std::operator<<(poVar3,(string *)fileName);
    std::operator<<(poVar3,'.');
  }
  else {
    if (this->dataType_ != 2) {
      this->dataType_ = 2;
      poVar3 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,
                               "FileWrite: using 16-bit signed integer data format for file ");
      poVar3 = std::operator<<(poVar3,(string *)fileName);
      std::operator<<(poVar3,'.');
      Stk::handleError(&this->super_Stk,WARNING);
    }
    this->byteswap_ = true;
    poVar3 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,"FileWrite: creating RAW file: ");
    std::operator<<(poVar3,(string *)fileName);
    Stk::handleError(&this->super_Stk,STATUS);
  }
  return pFVar2 != (FILE *)0x0;
}

Assistant:

bool FileWrite :: setRawFile( std::string fileName )
{
  if ( fileName.find( ".raw" ) == std::string::npos ) fileName += ".raw";
  fd_ = fopen( fileName.c_str(), "wb" );
  if ( !fd_ ) {
    oStream_ << "FileWrite: could not create RAW file: " << fileName << '.';
    return false;
  }

  if ( dataType_ != STK_SINT16 ) {
    dataType_ = STK_SINT16;
    oStream_ << "FileWrite: using 16-bit signed integer data format for file " << fileName << '.';
    handleError( StkError::WARNING );
  }

  byteswap_ = false;
#ifdef __LITTLE_ENDIAN__
  byteswap_ = true;
#endif

  oStream_ << "FileWrite: creating RAW file: " << fileName;
  handleError( StkError::STATUS );
  return true;
}